

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

QByteArray * __thiscall QIODevicePrivate::peek(QIODevicePrivate *this,qint64 maxSize)

{
  char *pcVar1;
  ssize_t sVar2;
  void *in_RDX;
  QIODevicePrivate *in_RSI;
  QByteArray *in_RDI;
  qint64 readBytes;
  QByteArray *result;
  Initialization in_stack_ffffffffffffffbc;
  QByteArray *size;
  
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  size = in_RDI;
  QByteArray::QByteArray(in_RDI,(qsizetype)in_RDI,in_stack_ffffffffffffffbc);
  pcVar1 = QByteArray::data(in_RDI);
  sVar2 = read(in_RSI,(int)pcVar1,in_RDX,1);
  if (sVar2 < (long)in_RDX) {
    if (sVar2 < 1) {
      QByteArray::clear((QByteArray *)0x1a5833);
    }
    else {
      QByteArray::resize((QByteArray *)in_RSI,(qsizetype)size);
    }
  }
  return in_RDI;
}

Assistant:

QByteArray QIODevicePrivate::peek(qint64 maxSize)
{
    QByteArray result(maxSize, Qt::Uninitialized);

    const qint64 readBytes = read(result.data(), maxSize, true);

    if (readBytes < maxSize) {
        if (readBytes <= 0)
            result.clear();
        else
            result.resize(readBytes);
    }

    return result;
}